

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_re_mode(char *re,int mode)

{
  int iVar1;
  mpc_result_t *pmVar2;
  mpc_err_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_parser_t *filename;
  mpc_err_t *x;
  mpc_parser_t *pmVar8;
  mpc_parser_t *pmVar9;
  mpc_parser_t *pmVar10;
  mpc_parser_t *pmVar11;
  char *__ptr;
  mpc_parser_t *RegexEnclose;
  mpc_parser_t *Range;
  mpc_parser_t *Base;
  mpc_parser_t *Factor;
  mpc_parser_t *Term;
  mpc_parser_t *Regex;
  mpc_result_t r;
  mpc_parser_t *err_out;
  char *err_msg;
  mpc_parser_t *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  mpc_err_t *x_00;
  mpc_result_t *r_00;
  mpc_err_t *a;
  mpc_parser_t *local_28;
  
  pmVar2 = (mpc_result_t *)mpc_new(in_stack_ffffffffffffff30);
  pmVar3 = (mpc_err_t *)mpc_new(in_stack_ffffffffffffff30);
  pmVar4 = mpc_new(in_stack_ffffffffffffff30);
  pmVar5 = mpc_new(in_stack_ffffffffffffff30);
  pmVar6 = mpc_new(in_stack_ffffffffffffff30);
  x_00 = pmVar3;
  r_00 = pmVar2;
  pmVar7 = mpc_char((char)((ulong)pmVar3 >> 0x38));
  mpc_and(2,mpcf_snd_free,pmVar7,pmVar2,free);
  pmVar7 = mpc_maybe((mpc_parser_t *)0x2996ab);
  mpc_and(2,mpcf_re_or,x_00,pmVar7,mpc_delete);
  mpc_define((mpc_parser_t *)x_00,in_stack_ffffffffffffff28);
  a = pmVar3;
  mpc_many((mpc_fold_t)x_00,in_stack_ffffffffffffff28);
  mpc_define((mpc_parser_t *)x_00,in_stack_ffffffffffffff28);
  pmVar7 = mpc_char((char)((ulong)x_00 >> 0x38));
  filename = mpc_char((char)((ulong)x_00 >> 0x38));
  x = (mpc_err_t *)mpc_char((char)((ulong)x_00 >> 0x38));
  mpc_int();
  pmVar8 = mpc_brackets((mpc_parser_t *)x_00,(mpc_dtor_t)in_stack_ffffffffffffff28);
  pmVar9 = mpc_pass();
  pmVar8 = mpc_or(5,pmVar7,filename,x,pmVar8,pmVar9);
  mpc_and(2,mpcf_re_repeat,pmVar5,pmVar8,mpc_delete);
  mpc_define((mpc_parser_t *)x_00,in_stack_ffffffffffffff28);
  pmVar8 = mpc_parens((mpc_parser_t *)x_00,(mpc_dtor_t)in_stack_ffffffffffffff28);
  pmVar9 = mpc_squares((mpc_parser_t *)x_00,(mpc_dtor_t)in_stack_ffffffffffffff28);
  mpc_escape();
  pmVar10 = mpc_apply_to((mpc_parser_t *)a,(mpc_apply_to_t)r_00,x_00);
  mpc_noneof((char *)x_00);
  pmVar11 = mpc_apply_to((mpc_parser_t *)a,(mpc_apply_to_t)r_00,x_00);
  mpc_or(4,pmVar8,pmVar9,pmVar10,pmVar11);
  mpc_define((mpc_parser_t *)x_00,in_stack_ffffffffffffff28);
  pmVar8 = mpc_escape();
  pmVar9 = mpc_noneof((char *)x_00);
  mpc_or(2,pmVar8,pmVar9);
  mpc_many((mpc_fold_t)x_00,in_stack_ffffffffffffff28);
  mpc_apply((mpc_parser_t *)x_00,(mpc_apply_t)in_stack_ffffffffffffff28);
  mpc_define((mpc_parser_t *)x_00,in_stack_ffffffffffffff28);
  mpc_predictive((mpc_parser_t *)x_00);
  pmVar8 = mpc_whole((mpc_parser_t *)a,(mpc_dtor_t)r_00);
  mpc_optimise((mpc_parser_t *)0x299900);
  mpc_optimise((mpc_parser_t *)0x29990d);
  mpc_optimise((mpc_parser_t *)0x29991a);
  mpc_optimise((mpc_parser_t *)0x299927);
  mpc_optimise((mpc_parser_t *)0x299934);
  mpc_optimise((mpc_parser_t *)0x299941);
  iVar1 = mpc_parse((char *)filename,(char *)pmVar7,(mpc_parser_t *)a,r_00);
  if (iVar1 == 0) {
    __ptr = mpc_err_string(x);
    local_28 = mpc_failf("Invalid Regex: %s",__ptr);
    mpc_err_delete(x_00);
    free(__ptr);
  }
  mpc_cleanup(6,pmVar8,pmVar2,pmVar3,pmVar4,pmVar5,pmVar6);
  mpc_optimise((mpc_parser_t *)0x299a14);
  return local_28;
}

Assistant:

mpc_parser_t *mpc_re_mode(const char *re, int mode) {

  char *err_msg;
  mpc_parser_t *err_out;
  mpc_result_t r;
  mpc_parser_t *Regex, *Term, *Factor, *Base, *Range, *RegexEnclose;

  Regex  = mpc_new("regex");
  Term   = mpc_new("term");
  Factor = mpc_new("factor");
  Base   = mpc_new("base");
  Range  = mpc_new("range");

  mpc_define(Regex, mpc_and(2, mpcf_re_or,
    Term,
    mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_char('|'), Regex, free)),
    (mpc_dtor_t)mpc_delete
  ));

  mpc_define(Term, mpc_many(mpcf_re_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcf_re_repeat,
    Base,
    mpc_or(5,
      mpc_char('*'), mpc_char('+'), mpc_char('?'),
      mpc_brackets(mpc_int(), free),
      mpc_pass()),
    (mpc_dtor_t)mpc_delete
  ));

  mpc_define(Base, mpc_or(4,
    mpc_parens(Regex, (mpc_dtor_t)mpc_delete),
    mpc_squares(Range, (mpc_dtor_t)mpc_delete),
    mpc_apply_to(mpc_escape(), mpcf_re_escape, &mode),
    mpc_apply_to(mpc_noneof(")|"), mpcf_re_escape, &mode)
  ));

  mpc_define(Range, mpc_apply(
    mpc_many(mpcf_strfold, mpc_or(2, mpc_escape(), mpc_noneof("]"))),
    mpcf_re_range
  ));

  RegexEnclose = mpc_whole(mpc_predictive(Regex), (mpc_dtor_t)mpc_delete);

  mpc_optimise(RegexEnclose);
  mpc_optimise(Regex);
  mpc_optimise(Term);
  mpc_optimise(Factor);
  mpc_optimise(Base);
  mpc_optimise(Range);

  if(!mpc_parse("<mpc_re_compiler>", re, RegexEnclose, &r)) {
    err_msg = mpc_err_string(r.error);
    err_out = mpc_failf("Invalid Regex: %s", err_msg);
    mpc_err_delete(r.error);
    free(err_msg);
    r.output = err_out;
  }

  mpc_cleanup(6, RegexEnclose, Regex, Term, Factor, Base, Range);

  mpc_optimise(r.output);

  return r.output;

}